

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O1

ze_result_t
zetGetMetricTracerExpProcAddrTable
          (ze_api_version_t version,zet_metric_tracer_exp_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (zet_metric_tracer_exp_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if ((int)version <= driver::context) {
      pDdiTable->pfnCreateExp = driver::zetMetricTracerCreateExp;
      pDdiTable->pfnDestroyExp = driver::zetMetricTracerDestroyExp;
      pDdiTable->pfnEnableExp = driver::zetMetricTracerEnableExp;
      pDdiTable->pfnDisableExp = driver::zetMetricTracerDisableExp;
      pDdiTable->pfnReadDataExp = driver::zetMetricTracerReadDataExp;
      pDdiTable->pfnDecodeExp = driver::zetMetricTracerDecodeExp;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zetGetMetricTracerExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zet_metric_tracer_exp_dditable_t* pDdiTable     ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnCreateExp                              = driver::zetMetricTracerCreateExp;

    pDdiTable->pfnDestroyExp                             = driver::zetMetricTracerDestroyExp;

    pDdiTable->pfnEnableExp                              = driver::zetMetricTracerEnableExp;

    pDdiTable->pfnDisableExp                             = driver::zetMetricTracerDisableExp;

    pDdiTable->pfnReadDataExp                            = driver::zetMetricTracerReadDataExp;

    pDdiTable->pfnDecodeExp                              = driver::zetMetricTracerDecodeExp;

    return result;
}